

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

decimal_fp<double> fmt::v11::detail::dragonbox::to_decimal<double>(double x)

{
  undefined1 auVar1 [16];
  decimal_fp<double> dVar2;
  uint32_t uVar3;
  bool bVar4;
  compute_mul_parity_result cVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  significand_type sVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  compute_mul_result cVar15;
  decimal_fp<double> dVar16;
  uint32_t dist;
  cache_entry_type cache;
  ulong local_40;
  int local_38;
  
  uVar9 = (ulong)x & 0xfffffffffffff;
  uVar12 = (uint)((ulong)x >> 0x34) & 0x7ff;
  if (uVar12 == 0) {
    iVar13 = -0x432;
    if (uVar9 == 0) {
      return (decimal_fp<double>)ZEXT816(0);
    }
  }
  else {
    iVar13 = uVar12 - 0x433;
    if (uVar9 == 0) {
      dVar16 = shorter_interval_case<double>(iVar13);
      return dVar16;
    }
    uVar9 = uVar9 + 0x10000000000000;
  }
  iVar6 = floor_log10_pow2(iVar13);
  dVar16._12_4_ = extraout_var;
  dVar16.exponent = iVar6;
  cache = cache_accessor<double>::get_cached_power(2 - iVar6);
  uVar8 = cache.hi_;
  iVar7 = floor_log2_pow10(2 - iVar6);
  iVar7 = iVar7 + iVar13;
  cVar15 = cache_accessor<double>::compute_mul(uVar9 * 2 + 1 << ((byte)iVar7 & 0x3f),&cache);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = cVar15.result;
  uVar10 = SUB168(auVar1 * ZEXT816(0x20c49ba5e353f7cf),8) >> 7;
  uVar12 = (int)cVar15.result + (int)uVar10 * -1000;
  uVar14 = (uint)(uVar8 >> (~(byte)iVar7 & 0x3f));
  local_40 = uVar10;
  if (uVar12 < uVar14) {
    if ((uVar12 != 0) || (((uint)(cVar15.is_integer & 1) & (uint)uVar9) == 0)) {
LAB_001b2747:
      local_38 = iVar6 + 1;
      iVar13 = remove_trailing_zeros(&local_40);
      dVar2.exponent = iVar13 + local_38;
      dVar2.significand = local_40;
      dVar2._12_4_ = 0;
      return dVar2;
    }
    uVar12 = 1000;
    uVar10 = uVar10 - 1;
  }
  else if ((uVar12 <= uVar14) &&
          (cVar5 = cache_accessor<double>::compute_mul_parity(uVar9 * 2 - 1,&cache,iVar7),
          (~(uint)uVar9 & (uint)((ushort)cVar5 >> 8) & 1) != 0 || ((ushort)cVar5 & 1) != 0))
  goto LAB_001b2747;
  uVar12 = uVar12 - (uVar14 >> 1);
  dist = uVar12 + 0x32;
  bVar4 = check_divisibility_and_divide_by_pow10<2>(&dist);
  uVar3 = dist;
  sVar11 = uVar10 * 10 + (ulong)dist;
  if (bVar4) {
    cVar5 = cache_accessor<double>::compute_mul_parity(uVar9 * 2,&cache,iVar7);
    if ((uVar12 & 1) == ((ushort)cVar5 & 1)) {
      sVar11 = sVar11 + (long)(int)-((ushort)cVar5 >> 8 & uVar3 & 1);
    }
    else {
      sVar11 = sVar11 - 1;
    }
  }
  dVar16.significand = sVar11;
  return dVar16;
}

Assistant:

auto to_decimal(T x) noexcept -> decimal_fp<T> {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << num_significand_bits<T>()) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent =
      static_cast<int>((br & exponent_mask<T>()) >> num_significand_bits<T>());

  if (exponent != 0) {  // Check if normal.
    exponent -= exponent_bias<T>() + num_significand_bits<T>();

    // Shorter interval case; proceed like Schubfach.
    // In fact, when exponent == 1 and significand == 0, the interval is
    // regular. However, it can be shown that the end-results are anyway same.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |= (static_cast<carrier_uint>(1) << num_significand_bits<T>());
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent =
        std::numeric_limits<T>::min_exponent - num_significand_bits<T>() - 1;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai.
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta);
  const carrier_uint two_fc = significand << 1;

  // For the case of binary32, the result of integer check is not correct for
  // 29711844 * 2^-82
  // = 6.1442653300000000008655037797566933477355632930994033813476... * 10^-18
  // and 29711844 * 2^-81
  // = 1.2288530660000000001731007559513386695471126586198806762695... * 10^-17,
  // and they are the unique counterexamples. However, since 29711844 is even,
  // this does not cause any problem for the endpoints calculations; it can only
  // cause a problem when we need to perform integer check for the center.
  // Fortunately, with these inputs, that branch is never executed, so we are
  // fine.
  const typename cache_accessor<T>::compute_mul_result z_mul =
      cache_accessor<T>::compute_mul((two_fc | 1) << beta, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary.

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here.
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(z_mul.result);
  uint32_t r = static_cast<uint32_t>(z_mul.result - float_info<T>::big_divisor *
                                                        ret_value.significand);

  if (r < deltai) {
    // Exclude the right endpoint if necessary.
    if (r == 0 && (z_mul.is_integer & !include_right_endpoint)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else if (r > deltai) {
    goto small_divisor_case_label;
  } else {
    // r == deltai; compare fractional parts.
    const typename cache_accessor<T>::compute_mul_parity_result x_mul =
        cache_accessor<T>::compute_mul_parity(two_fc - 1, cache, beta);

    if (!(x_mul.parity | (x_mul.is_integer & include_left_endpoint)))
      goto small_divisor_case_label;
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros.
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor.

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  uint32_t dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);
  const bool approx_y_parity =
      ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;

  // Is dist divisible by 10^kappa?
  const bool divisible_by_small_divisor =
      check_divisibility_and_divide_by_pow10<float_info<T>::kappa>(dist);

  // Add dist / 10^kappa to the significand.
  ret_value.significand += dist;

  if (!divisible_by_small_divisor) return ret_value;

  // Check z^(f) >= epsilon^(f).
  // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
  // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f).
  // Since there are only 2 possibilities, we only need to care about the
  // parity. Also, zi and r should have the same parity since the divisor
  // is an even number.
  const auto y_mul = cache_accessor<T>::compute_mul_parity(two_fc, cache, beta);

  // If z^(f) >= epsilon^(f), we might have a tie when z^(f) == epsilon^(f),
  // or equivalently, when y is an integer.
  if (y_mul.parity != approx_y_parity)
    --ret_value.significand;
  else if (y_mul.is_integer & (ret_value.significand % 2 != 0))
    --ret_value.significand;
  return ret_value;
}